

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O3

void __thiscall cmFindCommon::SelectDefaultMacMode(cmFindCommon *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  string fab;
  string ff;
  allocator local_81;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  pcVar2 = (this->super_cmCommand).Makefile;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CMAKE_FIND_FRAMEWORK","");
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar2,&local_80);
  std::__cxx11::string::string((string *)local_60,pcVar5,(allocator *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)local_60);
  if (iVar4 == 0) {
    bVar3 = false;
LAB_002f0d53:
    bVar6 = false;
LAB_002f0d63:
    bVar7 = false;
LAB_002f0d65:
    this->SearchFrameworkLast = bVar3;
    this->SearchFrameworkFirst = bVar6;
    this->SearchFrameworkOnly = bVar7;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_60);
    if (iVar4 == 0) {
      bVar7 = true;
      bVar3 = false;
      bVar6 = false;
      goto LAB_002f0d65;
    }
    iVar4 = std::__cxx11::string::compare((char *)local_60);
    if (iVar4 == 0) {
      bVar6 = true;
      bVar3 = false;
      goto LAB_002f0d63;
    }
    iVar4 = std::__cxx11::string::compare((char *)local_60);
    if (iVar4 == 0) {
      bVar3 = true;
      goto LAB_002f0d53;
    }
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_FIND_APPBUNDLE","");
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar2,&local_40);
  std::__cxx11::string::string((string *)&local_80,pcVar5,&local_81);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar4 == 0) {
    bVar3 = false;
LAB_002f0e2d:
    bVar6 = false;
LAB_002f0e3d:
    bVar7 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_80);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar4 != 0) goto LAB_002f0e51;
        bVar3 = true;
        goto LAB_002f0e2d;
      }
      bVar6 = true;
      bVar3 = false;
      goto LAB_002f0e3d;
    }
    bVar7 = true;
    bVar3 = false;
    bVar6 = false;
  }
  this->SearchAppBundleLast = bVar3;
  this->SearchAppBundleFirst = bVar6;
  this->SearchAppBundleOnly = bVar7;
LAB_002f0e51:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

void cmFindCommon::SelectDefaultMacMode()
{
  std::string ff = this->Makefile->GetSafeDefinition("CMAKE_FIND_FRAMEWORK");
  if(ff == "NEVER")
    {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
    }
  else if(ff == "ONLY")
    {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = true;
    }
  else if(ff == "FIRST")
    {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = true;
    this->SearchFrameworkOnly = false;
    }
  else if(ff == "LAST")
    {
    this->SearchFrameworkLast = true;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
    }

  std::string fab = this->Makefile->GetSafeDefinition("CMAKE_FIND_APPBUNDLE");
  if(fab == "NEVER")
    {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
    }
  else if(fab == "ONLY")
    {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = true;
    }
  else if(fab == "FIRST")
    {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = true;
    this->SearchAppBundleOnly = false;
    }
  else if(fab == "LAST")
    {
    this->SearchAppBundleLast = true;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
    }
}